

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

quaternion dja::operator*(quaternion *a,float_t b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  quaternion qVar3;
  
  uVar1 = (a->im).x;
  uVar2 = (a->im).y;
  qVar3.im.y = b * (float)uVar2;
  qVar3.im.x = b * (float)uVar1;
  qVar3.re = a->re * b;
  qVar3.im.z = b * (a->im).z;
  return qVar3;
}

Assistant:

Q OP*(const V1 a, const Q& b) {return Q(a * b.re, a * b.im);}